

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O0

int tcp_get_sockname(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int *piVar2;
  undefined1 local_150 [8];
  nng_sockaddr sa;
  int local_c0;
  int rv;
  int fd;
  socklen_t len;
  sockaddr_storage ss;
  nni_tcp_conn *c;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  rv = 0x80;
  ss.__ss_align = (unsigned_long)arg;
  local_c0 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  iVar1 = getsockname(local_c0,(sockaddr *)&fd,(socklen_t *)&rv);
  if (iVar1 == 0) {
    sa.s_storage.sa_pad[0xf]._4_4_ =
         nni_posix_sockaddr2nn((nni_sockaddr *)local_150,&fd,(ulong)(uint)rv);
    if (sa.s_storage.sa_pad[0xf]._4_4_ == 0) {
      sa.s_storage.sa_pad[0xf]._4_4_ = nni_copyout_sockaddr((nng_sockaddr *)local_150,buf,szp,t);
    }
    arg_local._4_4_ = sa.s_storage.sa_pad[0xf]._4_4_;
  }
  else {
    piVar2 = __errno_location();
    arg_local._4_4_ = nni_plat_errno(*piVar2);
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_get_sockname(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_tcp_conn           *c = arg;
	struct sockaddr_storage ss;
	socklen_t               len = sizeof(ss);
	int                     fd  = nni_posix_pfd_fd(&c->pfd);
	int                     rv;
	nng_sockaddr            sa;

	if (getsockname(fd, (void *) &ss, &len) != 0) {
		return (nni_plat_errno(errno));
	}
	if ((rv = nni_posix_sockaddr2nn(&sa, &ss, len)) == 0) {
		rv = nni_copyout_sockaddr(&sa, buf, szp, t);
	}
	return (rv);
}